

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_timer.cpp
# Opt level: O1

double __thiscall lzham::lzham_timer::get_elapsed_secs(lzham_timer *this)

{
  timer_ticks tVar1;
  long lVar2;
  double dVar3;
  undefined1 auVar4 [16];
  
  dVar3 = 0.0;
  if ((this->field_0x10 & 1) != 0) {
    if ((this->field_0x10 & 2) == 0) {
      tVar1 = clock();
    }
    else {
      tVar1 = this->m_stop_time;
    }
    lVar2 = tVar1 - this->m_start_time;
    auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = 0x45300000;
    dVar3 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * g_inv_freq;
  }
  return dVar3;
}

Assistant:

double lzham_timer::get_elapsed_secs() const
   {
      LZHAM_ASSERT(m_started);
      if (!m_started)
         return 0;
      
      timer_ticks stop_time = m_stop_time;
      if (!m_stopped)
         query_counter(&stop_time);
         
      timer_ticks delta = stop_time - m_start_time;
      return delta * g_inv_freq;
   }